

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitStringTest_random_long_prefix_two_delim_Test<char8_t>::TestBody
          (SplitStringTest_random_long_prefix_two_delim_Test<char8_t> *this)

{
  pointer *ppbVar1;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  *pvVar2;
  bool bVar3;
  char *pcVar4;
  AssertHelper local_170 [8];
  Message local_168 [8];
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  split_result;
  __normal_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_*,_std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>_>
  local_130;
  const_iterator local_128;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *local_120;
  __normal_iterator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_*,_std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>_>
  local_118;
  const_iterator local_110;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_108;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_e8;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_b8;
  undefined1 local_98 [8];
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  data;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> delim;
  SplitStringTest_random_long_prefix_two_delim_Test<char8_t> *this_local;
  
  ppbVar1 = &data.m_tokens.
             super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  make_delim_long<char8_t,std::__cxx11::u8string>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)ppbVar1,8
             ,'\0');
  std::__cxx11::u8string::u8string
            ((u8string *)&local_b8,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)ppbVar1);
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::RandomTestData((RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                    *)local_98,&local_b8,0,0);
  std::__cxx11::u8string::~u8string((u8string *)&local_b8);
  ppbVar1 = &data.m_tokens.
             super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::operator+(&local_108,
                 (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                 ppbVar1,(basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                          *)ppbVar1);
  std::operator+(&local_e8,&local_108,
                 (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                 &data.m_fixed_word_length);
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  operator=((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
            &data.m_fixed_word_length,&local_e8);
  std::__cxx11::u8string::~u8string((u8string *)&local_e8);
  std::__cxx11::u8string::~u8string((u8string *)&local_108);
  pvVar2 = (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
            *)((long)&data.m_str.field_2 + 8);
  local_118._M_current =
       (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
       std::
       vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
       ::begin(pvVar2);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::u8string_const*,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
  ::__normal_iterator<std::__cxx11::u8string*>
            ((__normal_iterator<std::__cxx11::u8string_const*,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
              *)&local_110,&local_118);
  local_120 = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
              std::
              vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ::emplace<>(pvVar2,local_110);
  pvVar2 = (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
            *)((long)&data.m_str.field_2 + 8);
  local_130._M_current =
       (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
       std::
       vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
       ::begin(pvVar2);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::u8string_const*,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
  ::__normal_iterator<std::__cxx11::u8string*>
            ((__normal_iterator<std::__cxx11::u8string_const*,std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>>
              *)&local_128,&local_130);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::emplace<>(pvVar2,local_128);
  jessilib::
  split<std::vector,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((container_type *)&gtest_ar.message_,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &data.m_fixed_word_length,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &data.m_tokens.
              super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper::
  Compare<std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((EqHelper *)local_160,"split_result","data.m_tokens",
             (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar.message_,
             (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)((long)&data.m_str.field_2 + 8));
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar3) {
    testing::Message::Message(local_168);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x115,pcVar4);
    testing::internal::AssertHelper::operator=(local_170,local_168);
    testing::internal::AssertHelper::~AssertHelper(local_170);
    testing::Message::~Message(local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)&gtest_ar.message_);
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::~RandomTestData((RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                     *)local_98);
  std::__cxx11::u8string::~u8string
            ((u8string *)
             &data.m_tokens.
              super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random_long_prefix_two_delim) {
	auto delim = make_delim_long<TypeParam>(8);
	RandomTestData<TypeParam> data{ delim };
	data.m_str = delim + delim + data.m_str;
	data.m_tokens.emplace(data.m_tokens.begin());
	data.m_tokens.emplace(data.m_tokens.begin());
	std::vector<std::basic_string<TypeParam>> split_result = split(data.m_str, delim);
	EXPECT_EQ(split_result, data.m_tokens);
}